

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

AtomicCmpxchg * __thiscall
wasm::Builder::makeAtomicCmpxchg
          (Builder *this,uint bytes,Address offset,Expression *ptr,Expression *expected,
          Expression *replacement,Type type,Name memory)

{
  AtomicCmpxchg *pAVar1;
  
  pAVar1 = MixedArena::alloc<wasm::AtomicCmpxchg>(&this->wasm->allocator);
  pAVar1->bytes = (uint8_t)bytes;
  (pAVar1->offset).addr = offset.addr;
  pAVar1->ptr = ptr;
  pAVar1->expected = expected;
  pAVar1->replacement = replacement;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = type.id;
  ::wasm::AtomicCmpxchg::finalize();
  (pAVar1->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pAVar1->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  return pAVar1;
}

Assistant:

AtomicCmpxchg* makeAtomicCmpxchg(unsigned bytes,
                                   Address offset,
                                   Expression* ptr,
                                   Expression* expected,
                                   Expression* replacement,
                                   Type type,
                                   Name memory) {
    auto* ret = wasm.allocator.alloc<AtomicCmpxchg>();
    ret->bytes = bytes;
    ret->offset = offset;
    ret->ptr = ptr;
    ret->expected = expected;
    ret->replacement = replacement;
    ret->type = type;
    ret->finalize();
    ret->memory = memory;
    return ret;
  }